

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O3

void helper_hlt_x86_64(CPUX86State *env,int next_eip_addend)

{
  CPUX86State *__mptr;
  CPUState *cs;
  uintptr_t unaff_retaddr;
  
  cpu_svm_check_intercept_param_x86_64(env,0x78,0,unaff_retaddr);
  env->eip = env->eip + (long)next_eip_addend;
  *(byte *)&env->hflags = (byte)env->hflags & 0xf7;
  *(undefined4 *)((long)env[-1].hi16_zmm_regs + 1000) = 1;
  *(undefined4 *)((long)env[-1].hi16_zmm_regs + 0x3f0) = 0x10001;
  cpu_loop_exit_x86_64((CPUState *)(env[-6].mtrr_var + 4));
}

Assistant:

void helper_hlt(CPUX86State *env, int next_eip_addend)
{
    X86CPU *cpu = env_archcpu(env);

    cpu_svm_check_intercept_param(env, SVM_EXIT_HLT, 0, GETPC());
    env->eip += next_eip_addend;

    do_hlt(cpu);
}